

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O0

void __thiscall obs::safe_list<Observer>::iterator::~iterator(iterator *this)

{
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> l;
  iterator *this_local;
  
  l._M_device = (mutex_type *)this;
  if (this->m_node != (node *)0x0) {
    std::lock_guard<std::mutex>::lock_guard(&local_18,&this->m_list->m_mutex_nodes);
    unlock(this);
    std::lock_guard<std::mutex>::~lock_guard(&local_18);
  }
  if (((this->m_locked ^ 0xffU) & 1) == 0) {
    __assert_fail("!m_locked",
                  "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                  ,0xb3,"obs::safe_list<Observer>::iterator::~iterator() [T = Observer]");
  }
  unref(this->m_list);
  return;
}

Assistant:

~iterator() {
      if (m_node) {
        std::lock_guard<std::mutex> l(m_list.m_mutex_nodes);
        unlock();
      }

      assert(!m_locked);
      m_list.unref();
    }